

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_5,_8>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  bool bVar1;
  long lVar2;
  undefined8 *puVar3;
  float *pfVar4;
  int col;
  long lVar5;
  bool bVar6;
  float v;
  float fVar7;
  float afVar8 [2];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar12;
  undefined4 uVar13;
  float afStack_88 [2];
  Matrix<float,_2,_3> res;
  undefined1 auStack_68 [8];
  Type in1;
  float local_48 [4];
  undefined1 auStack_38 [8];
  Type in0;
  int aiStack_20 [6];
  long lVar11;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    auStack_38 = *(undefined1 (*) [8])evalCtx->in[0].m_data;
    afVar8 = *(float (*) [2])evalCtx->in[1].m_data;
  }
  else {
    auStack_38 = (undefined1  [8])0xbe4ccccdbdcccccd;
    afVar8[0] = 1.0;
    afVar8[1] = 0.0;
  }
  in0.m_data.m_data[0].m_data[0] = afVar8[0];
  in0.m_data.m_data[0].m_data[1] = afVar8[1];
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    puVar3 = (undefined8 *)auStack_68;
    bVar12 = true;
    do {
      bVar1 = bVar12;
      lVar5 = 0;
      auVar9 = _DAT_019f34d0;
      do {
        bVar12 = SUB164(auVar9 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar9 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar12) {
          uVar13 = 0x3f800000;
          if (lVar2 != lVar5) {
            uVar13 = 0;
          }
          *(undefined4 *)(puVar3 + lVar5) = uVar13;
        }
        if (bVar12) {
          uVar13 = 0x3f800000;
          if (lVar2 + -1 != lVar5) {
            uVar13 = 0;
          }
          *(undefined4 *)(puVar3 + lVar5 + 1) = uVar13;
        }
        lVar5 = lVar5 + 2;
        lVar11 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar11 + 2;
      } while (lVar5 != 4);
      lVar2 = 1;
      puVar3 = (undefined8 *)((long)auStack_68 + 4);
      bVar12 = false;
    } while (bVar1);
    auStack_68 = (undefined1  [8])*(undefined8 *)evalCtx->in[0].m_data;
    in1.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    in1.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    auStack_68 = (undefined1  [8])0x0;
    in1.m_data.m_data[0].m_data[0] = 0.0;
    in1.m_data.m_data[0].m_data[1] = 0.0;
    in1.m_data.m_data[1].m_data[0] = 0.0;
    in1.m_data.m_data[1].m_data[1] = 0.0;
    lVar2 = 0;
    puVar3 = (undefined8 *)auStack_68;
    bVar12 = true;
    do {
      bVar1 = bVar12;
      lVar5 = 0;
      do {
        *(undefined4 *)(puVar3 + lVar5) = *(undefined4 *)((long)&DAT_01beae38 + lVar5 * 4 + lVar2);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar2 = 0xc;
      puVar3 = (undefined8 *)((long)auStack_68 + 4);
      bVar12 = false;
    } while (bVar1);
  }
  lVar2 = 0;
  pfVar4 = afStack_88;
  bVar12 = true;
  do {
    bVar1 = bVar12;
    lVar5 = 0;
    auVar10 = _DAT_019f34d0;
    do {
      bVar12 = SUB164(auVar10 ^ _DAT_019ec5b0,4) == -0x80000000 &&
               SUB164(auVar10 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
      if (bVar12) {
        fVar7 = 1.0;
        if (lVar2 != lVar5) {
          fVar7 = 0.0;
        }
        pfVar4[lVar5 * 2] = fVar7;
      }
      if (bVar12) {
        fVar7 = 1.0;
        if (lVar2 + -1 != lVar5) {
          fVar7 = 0.0;
        }
        pfVar4[lVar5 * 2 + 2] = fVar7;
      }
      lVar5 = lVar5 + 2;
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar11 + 2;
    } while (lVar5 != 4);
    lVar2 = 1;
    pfVar4 = afStack_88 + 1;
    bVar12 = false;
  } while (bVar1);
  pfVar4 = afStack_88;
  puVar3 = (undefined8 *)auStack_38;
  bVar12 = true;
  do {
    bVar1 = bVar12;
    lVar2 = 0;
    do {
      fVar7 = 0.0;
      lVar5 = 0;
      bVar12 = true;
      do {
        bVar6 = bVar12;
        fVar7 = fVar7 + *(float *)(puVar3 + lVar5) * in1.m_data.m_data[lVar2 + -1].m_data[lVar5];
        lVar5 = 1;
        bVar12 = false;
      } while (bVar6);
      pfVar4[lVar2 * 2] = fVar7;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    pfVar4 = afStack_88 + 1;
    puVar3 = (undefined8 *)((long)auStack_38 + 4);
    bVar12 = false;
  } while (bVar1);
  aiStack_20[2] = 0;
  aiStack_20[3] = 1;
  aiStack_20[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[aiStack_20[lVar2]] = local_48[lVar2 + -2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}